

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O0

ssize_t __thiscall
capnp::_::PackedOutputStream::write(PackedOutputStream *this,int __fd,void *__buf,size_t __n)

{
  BufferedOutputStream *pBVar1;
  uint64_t *puVar2;
  int iVar3;
  undefined4 extraout_var;
  uchar *puVar4;
  uint64_t *puVar5;
  ulong uVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint8_t *puVar7;
  undefined4 in_register_00000034;
  bool bVar8;
  ArrayPtr<unsigned_char> local_130;
  ArrayPtr<const_unsigned_char> local_120;
  uint8_t *local_110;
  ArrayPtr<const_unsigned_char> local_100;
  ArrayPtr<unsigned_char> local_f0;
  ArrayPtr<const_unsigned_char> local_e0;
  uint local_d0;
  uint local_cc;
  uint count;
  uint c;
  uint8_t *limit_1;
  uint8_t *runStart;
  uint64_t *limit;
  uint64_t *inWord;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  uint8_t tag;
  uint8_t bit7;
  uint8_t bit6;
  uint8_t bit5;
  uint8_t bit4;
  uint8_t bit3;
  uint8_t bit2;
  uint8_t bit1;
  uint8_t bit0;
  uint8_t *tagPos;
  ArrayPtr<unsigned_char> local_80;
  ArrayPtr<const_unsigned_char> local_70;
  uchar *local_60;
  uint8_t *inEnd;
  uint8_t *in;
  uint8_t *out;
  byte slowBuffer [20];
  ArrayPtr<unsigned_char> buffer;
  PackedOutputStream *this_local;
  ArrayPtr<const_unsigned_char> src_local;
  
  this_local = (PackedOutputStream *)CONCAT44(in_register_00000034,__fd);
  src_local.ptr = (uchar *)__buf;
  iVar3 = (*(this->inner->super_OutputStream)._vptr_OutputStream[4])();
  register0x00000000 = (uint8_t *)CONCAT44(extraout_var,iVar3);
  memset(&out,0,0x14);
  in = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(slowBuffer + 0x10));
  inEnd = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  local_60 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&this_local);
  puVar5 = (uint64_t *)inEnd;
  do {
    do {
      while( true ) {
        inEnd = (uint8_t *)puVar5;
        puVar7 = in;
        if (local_60 <= inEnd) {
          pBVar1 = this->inner;
          puVar4 = kj::ArrayPtr<unsigned_char>::begin
                             ((ArrayPtr<unsigned_char> *)(slowBuffer + 0x10));
          local_130 = kj::ArrayPtr<unsigned_char>::first
                                ((ArrayPtr<unsigned_char> *)(slowBuffer + 0x10),
                                 (long)puVar7 - (long)puVar4);
          local_120 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_130);
          iVar3 = (*(pBVar1->super_OutputStream)._vptr_OutputStream[2])
                            (pBVar1,local_120.ptr,local_120.size_);
          return CONCAT44(extraout_var_01,iVar3);
        }
        puVar4 = kj::ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)(slowBuffer + 0x10));
        puVar7 = in;
        if ((long)puVar4 - (long)in < 10) {
          pBVar1 = this->inner;
          puVar4 = kj::ArrayPtr<unsigned_char>::begin
                             ((ArrayPtr<unsigned_char> *)(slowBuffer + 0x10));
          local_80 = kj::ArrayPtr<unsigned_char>::first
                               ((ArrayPtr<unsigned_char> *)(slowBuffer + 0x10),
                                (long)puVar7 - (long)puVar4);
          local_70 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_80);
          (*(pBVar1->super_OutputStream)._vptr_OutputStream[2])(pBVar1,local_70.ptr,local_70.size_);
          _tagPos = kj::arrayPtr<unsigned_char>((uchar *)&out,0x14);
          stack0xffffffffffffffd0 = tagPos;
          in = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(slowBuffer + 0x10));
        }
        puVar7 = in + 1;
        _bit7 = in;
        tag = *inEnd != '\0';
        *puVar7 = *inEnd;
        puVar7 = puVar7 + (int)(uint)tag;
        local_9a = inEnd[1] != '\0';
        *puVar7 = inEnd[1];
        puVar7 = puVar7 + (int)(uint)(byte)local_9a;
        local_9b = inEnd[2] != '\0';
        *puVar7 = inEnd[2];
        puVar7 = puVar7 + (int)(uint)(byte)local_9b;
        local_9c = inEnd[3] != '\0';
        *puVar7 = inEnd[3];
        puVar7 = puVar7 + (int)(uint)(byte)local_9c;
        local_9d = inEnd[4] != '\0';
        *puVar7 = inEnd[4];
        puVar7 = puVar7 + (int)(uint)(byte)local_9d;
        local_9e = inEnd[5] != '\0';
        *puVar7 = inEnd[5];
        puVar7 = puVar7 + (int)(uint)(byte)local_9e;
        local_9f = inEnd[6] != '\0';
        *puVar7 = inEnd[6];
        local_a0 = inEnd[7] != '\0';
        puVar7[(int)(uint)(byte)local_9f] = inEnd[7];
        puVar7 = puVar7 + (int)(uint)(byte)local_9f + (int)(uint)(byte)local_a0;
        puVar5 = (uint64_t *)(inEnd + 8);
        inWord._7_1_ = tag | local_9a << 1 | local_9b << 2 | local_9c << 3 | local_9d << 4 |
                       local_9e << 5 | local_9f << 6 | local_a0 << 7;
        *in = inWord._7_1_;
        if (inWord._7_1_ != 0) break;
        runStart = local_60;
        limit = puVar5;
        if (0xff < (long)local_60 - (long)puVar5 >> 3) {
          runStart = inEnd + 0x800;
        }
        while( true ) {
          bVar8 = false;
          if (limit < runStart) {
            bVar8 = *limit == 0;
          }
          if (!bVar8) break;
          limit = limit + 1;
        }
        *puVar7 = (uint8_t)((long)limit - (long)puVar5 >> 3);
        inEnd = (uint8_t *)limit;
        puVar5 = (uint64_t *)inEnd;
        in = puVar7 + 1;
      }
      in = puVar7;
    } while (inWord._7_1_ != 0xff);
    _count = local_60;
    puVar2 = puVar5;
    if (0x7f8 < (ulong)((long)local_60 - (long)puVar5)) {
      _count = inEnd + 0x800;
    }
    do {
      inEnd = (uint8_t *)puVar2;
      if (_count <= inEnd) break;
      local_cc = (uint)(inEnd[7] == '\0') +
                 (uint)(inEnd[6] == '\0') +
                 (uint)(inEnd[5] == '\0') +
                 (uint)(inEnd[4] == '\0') +
                 (uint)(inEnd[3] == '\0') +
                 (uint)(inEnd[2] == '\0') + (uint)(inEnd[1] == '\0') + (uint)(*inEnd == '\0');
      puVar2 = (uint64_t *)(inEnd + 8);
    } while (local_cc < 2);
    local_d0 = (int)inEnd - (int)puVar5;
    in = puVar7 + 1;
    *puVar7 = (uint8_t)(local_d0 >> 3);
    uVar6 = (ulong)local_d0;
    limit_1 = (uint8_t *)puVar5;
    puVar4 = kj::ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)(slowBuffer + 0x10));
    puVar7 = in;
    if ((long)puVar4 - (long)in < (long)uVar6) {
      pBVar1 = this->inner;
      puVar4 = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(slowBuffer + 0x10));
      local_f0 = kj::ArrayPtr<unsigned_char>::first
                           ((ArrayPtr<unsigned_char> *)(slowBuffer + 0x10),
                            (long)puVar7 - (long)puVar4);
      local_e0 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_f0);
      (*(pBVar1->super_OutputStream)._vptr_OutputStream[2])(pBVar1,local_e0.ptr,local_e0.size_);
      pBVar1 = this->inner;
      local_100 = kj::arrayPtr<unsigned_char_const>(limit_1,(long)inEnd - (long)limit_1);
      (*(pBVar1->super_OutputStream)._vptr_OutputStream[2])(pBVar1,local_100.ptr,local_100.size_);
      iVar3 = (*(this->inner->super_OutputStream)._vptr_OutputStream[4])();
      local_110 = (uint8_t *)CONCAT44(extraout_var_00,iVar3);
      unique0x1000057f = local_110;
      in = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(slowBuffer + 0x10));
      puVar5 = (uint64_t *)inEnd;
    }
    else {
      memcpy(in,limit_1,(ulong)local_d0);
      in = in + local_d0;
      puVar5 = (uint64_t *)inEnd;
    }
  } while( true );
}

Assistant:

void PackedOutputStream::write(kj::ArrayPtr<const byte> src) {
  kj::ArrayPtr<byte> buffer = inner.getWriteBuffer();
  byte slowBuffer[20]{};

  uint8_t* __restrict__ out = reinterpret_cast<uint8_t*>(buffer.begin());

  const uint8_t* __restrict__ in = src.begin();
  const uint8_t* const inEnd = src.end();

  while (in < inEnd) {
    if (reinterpret_cast<uint8_t*>(buffer.end()) - out < 10) {
      // Oops, we're out of space.  We need at least 10 bytes for the fast path, since we don't
      // bounds-check on every byte.

      // Write what we have so far.
      inner.write(buffer.first(out - reinterpret_cast<uint8_t*>(buffer.begin())));

      // Use a slow buffer into which we'll encode 10 to 20 bytes.  This should get us past the
      // output stream's buffer boundary.
      buffer = kj::arrayPtr(slowBuffer, sizeof(slowBuffer));
      out = reinterpret_cast<uint8_t*>(buffer.begin());
    }

    uint8_t* tagPos = out++;

#define HANDLE_BYTE(n) \
    uint8_t bit##n = *in != 0; \
    *out = *in; \
    out += bit##n; /* out only advances if the byte was non-zero */ \
    ++in

    HANDLE_BYTE(0);
    HANDLE_BYTE(1);
    HANDLE_BYTE(2);
    HANDLE_BYTE(3);
    HANDLE_BYTE(4);
    HANDLE_BYTE(5);
    HANDLE_BYTE(6);
    HANDLE_BYTE(7);
#undef HANDLE_BYTE

    uint8_t tag = (bit0 << 0) | (bit1 << 1) | (bit2 << 2) | (bit3 << 3)
                | (bit4 << 4) | (bit5 << 5) | (bit6 << 6) | (bit7 << 7);
    *tagPos = tag;

    if (tag == 0) {
      // An all-zero word is followed by a count of consecutive zero words (not including the
      // first one).

      // We can check a whole word at a time. (Here is where we use the assumption that
      // `src` is word-aligned.)
      const uint64_t* inWord = reinterpret_cast<const uint64_t*>(in);

      // The count must fit it 1 byte, so limit to 255 words.
      const uint64_t* limit = reinterpret_cast<const uint64_t*>(inEnd);
      if (limit - inWord > 255) {
        limit = inWord + 255;
      }

      while (inWord < limit && *inWord == 0) {
        ++inWord;
      }

      // Write the count.
      *out++ = inWord - reinterpret_cast<const uint64_t*>(in);

      // Advance input.
      in = reinterpret_cast<const uint8_t*>(inWord);

    } else if (tag == 0xffu) {
      // An all-nonzero word is followed by a count of consecutive uncompressed words, followed
      // by the uncompressed words themselves.

      // Count the number of consecutive words in the input which have no more than a single
      // zero-byte.  We look for at least two zeros because that's the point where our compression
      // scheme becomes a net win.
      // TODO(perf):  Maybe look for three zeros?  Compressing a two-zero word is a loss if the
      //   following word has no zeros.
      const uint8_t* runStart = in;

      const uint8_t* limit = inEnd;
      if ((size_t)(limit - in) > 255 * sizeof(word)) {
        limit = in + 255 * sizeof(word);
      }

      while (in < limit) {
        // Check eight input bytes for zeros.
        uint c = *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;

        if (c >= 2) {
          // Un-read the word with multiple zeros, since we'll want to compress that one.
          in -= 8;
          break;
        }
      }

      // Write the count.
      uint count = in - runStart;
      *out++ = count / sizeof(word);

      if (count <= reinterpret_cast<uint8_t*>(buffer.end()) - out) {
        // There's enough space to memcpy.
        memcpy(out, runStart, count);
        out += count;
      } else {
        // Input overruns the output buffer.  We'll give it to the output stream in one chunk
        // and let it decide what to do.
        inner.write(buffer.first(reinterpret_cast<byte*>(out) - buffer.begin()));
        inner.write(kj::arrayPtr(runStart, in - runStart));
        buffer = inner.getWriteBuffer();
        out = reinterpret_cast<uint8_t*>(buffer.begin());
      }
    }
  }

  // Write whatever is left.
  inner.write(buffer.first(reinterpret_cast<byte*>(out) - buffer.begin()));
}